

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

int __thiscall Cmd::editInsert(Cmd *this,State *state,char ch)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  ssize_t sVar6;
  char local_39;
  char d;
  char ch_local;
  State *state_local;
  Cmd *this_local;
  
  sVar3 = std::__cxx11::string::size();
  if (sVar3 == state->pos) {
    uVar1 = state->pos;
    state->pos = uVar1 + 1;
    std::__cxx11::string::insert((ulong)state,uVar1,'\x01');
    if ((this->multiline_mode & 1U) == 0) {
      lVar4 = std::__cxx11::string::size();
      lVar5 = std::__cxx11::string::size();
      if (((ulong)(lVar4 + lVar5) < state->cols) &&
         (bVar2 = std::function::operator_cast_to_bool((function *)&this->hints_handler_), !bVar2))
      {
        local_39 = ch;
        if ((state->mask_mode & 1U) != 0) {
          local_39 = '*';
        }
        sVar6 = write_char(this,local_39);
        if (sVar6 != -1) {
          return 0;
        }
        return -1;
      }
    }
    refreshLine(this,state);
  }
  else {
    uVar1 = state->pos;
    state->pos = uVar1 + 1;
    std::__cxx11::string::insert((ulong)state,uVar1,'\x01');
    refreshLine(this,state);
  }
  return 0;
}

Assistant:

int editInsert(State *state, char ch) {
		if (state->buf.size() == state->pos) {
			state->buf.insert(state->pos++, 1, ch);

			if (!multiline_mode && prompt.size() + state->buf.size() < state->cols && !hints_handler_) {
				// Avoid a full update of the line in the trivial case.
				const char d = (state->mask_mode) ? '*' : ch;
				if (write_char(d) == -1) {
					return -1;
				}
			} else {
				refreshLine(state);
			}
		} else {
			state->buf.insert(state->pos++, 1, ch);
			refreshLine(state);
		}
		return 0;
	}